

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Sales.cpp
# Opt level: O0

void __thiscall
L15_4::LabeledSales::LabeledSales(LabeledSales *this,string *lb,int y,double *gr,int n)

{
  int n_local;
  double *gr_local;
  int y_local;
  string *lb_local;
  LabeledSales *this_local;
  
  Sales::Sales(&this->super_Sales,y,gr,n);
  (this->super_Sales)._vptr_Sales = (_func_int **)&PTR__LabeledSales_0015fac0;
  std::__cxx11::string::string((string *)&this->_label);
  std::__cxx11::string::operator=((string *)&this->_label,(string *)lb);
  return;
}

Assistant:

LabeledSales::LabeledSales(const std::string & lb, int y, const double *gr, int n): Sales(y, gr, n) {
        _label = lb;
    }